

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O0

bool __thiscall S2Cell::Subdivide(S2Cell *this,S2Cell *children)

{
  bool bVar1;
  int i_00;
  uint i_01;
  R1Interval *pRVar2;
  double *pdVar3;
  double dVar4;
  int j;
  int i;
  int ij;
  S2Cell *child;
  S2CellId SStack_38;
  int pos;
  S2CellId id;
  R2Point uv_mid;
  S2Cell *children_local;
  S2Cell *this_local;
  
  bVar1 = S2CellId::is_leaf(&this->id_);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    _id = S2CellId::GetCenterUV(&this->id_);
    SStack_38 = S2CellId::child_begin(&this->id_);
    child._4_4_ = 0;
    while (child._4_4_ < 4) {
      children[child._4_4_].face_ = this->face_;
      children[child._4_4_].level_ = this->level_ + '\x01';
      children[child._4_4_].orientation_ =
           this->orientation_ ^ (byte)(&S2::internal::kPosToOrientation)[child._4_4_];
      children[child._4_4_].id_.id_ = SStack_38.id_;
      i_00 = (int)*(uint *)(S2::internal::kPosToIJ +
                           (long)child._4_4_ * 4 + (long)this->orientation_ * 0x10) >> 1;
      i_01 = *(uint *)(S2::internal::kPosToIJ +
                      (long)child._4_4_ * 4 + (long)this->orientation_ * 0x10) & 1;
      pRVar2 = R2Rect::operator[](&this->uv_,0);
      dVar4 = R1Interval::operator[](pRVar2,i_00);
      pRVar2 = R2Rect::operator[](&children[child._4_4_].uv_,0);
      pdVar3 = R1Interval::operator[](pRVar2,i_00);
      *pdVar3 = dVar4;
      pdVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                         ((BasicVector<Vector2,_double,_2UL> *)&id,0);
      dVar4 = *pdVar3;
      pRVar2 = R2Rect::operator[](&children[child._4_4_].uv_,0);
      pdVar3 = R1Interval::operator[](pRVar2,1 - i_00);
      *pdVar3 = dVar4;
      pRVar2 = R2Rect::operator[](&this->uv_,1);
      dVar4 = R1Interval::operator[](pRVar2,i_01);
      pRVar2 = R2Rect::operator[](&children[child._4_4_].uv_,1);
      pdVar3 = R1Interval::operator[](pRVar2,i_01);
      *pdVar3 = dVar4;
      pdVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                         ((BasicVector<Vector2,_double,_2UL> *)&id,1);
      dVar4 = *pdVar3;
      pRVar2 = R2Rect::operator[](&children[child._4_4_].uv_,1);
      pdVar3 = R1Interval::operator[](pRVar2,1 - i_01);
      *pdVar3 = dVar4;
      child._4_4_ = child._4_4_ + 1;
      SStack_38 = S2CellId::next(&stack0xffffffffffffffc8);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool S2Cell::Subdivide(S2Cell children[4]) const {
  // This function is equivalent to just iterating over the child cell ids
  // and calling the S2Cell constructor, but it is about 2.5 times faster.

  if (id_.is_leaf()) return false;

  // Compute the cell midpoint in uv-space.
  R2Point uv_mid = id_.GetCenterUV();

  // Create four children with the appropriate bounds.
  S2CellId id = id_.child_begin();
  for (int pos = 0; pos < 4; ++pos, id = id.next()) {
    S2Cell *child = &children[pos];
    child->face_ = face_;
    child->level_ = level_ + 1;
    child->orientation_ = orientation_ ^ kPosToOrientation[pos];
    child->id_ = id;
    // We want to split the cell in half in "u" and "v".  To decide which
    // side to set equal to the midpoint value, we look at cell's (i,j)
    // position within its parent.  The index for "i" is in bit 1 of ij.
    int ij = kPosToIJ[orientation_][pos];
    int i = ij >> 1;
    int j = ij & 1;
    child->uv_[0][i] = uv_[0][i];
    child->uv_[0][1-i] = uv_mid[0];
    child->uv_[1][j] = uv_[1][j];
    child->uv_[1][1-j] = uv_mid[1];
  }
  return true;
}